

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_context.cpp
# Opt level: O2

unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>,_true>
__thiscall
duckdb::ClientContext::Prepare
          (ClientContext *this,
          unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>
          *statement)

{
  _Head_base<0UL,_duckdb::SQLStatement_*,_false> _Var1;
  pointer pSVar2;
  type pCVar3;
  unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true> *in_RDX;
  unique_ptr<duckdb::ClientContextLock,_std::default_delete<duckdb::ClientContextLock>,_true> lock;
  string query;
  unique_ptr<duckdb::ClientContextLock,_std::default_delete<duckdb::ClientContextLock>_> local_c8;
  string local_c0 [160];
  
  make_uniq<duckdb::ClientContextLock,std::mutex&>((duckdb *)&local_c8,(mutex *)(statement + 0x48));
  pSVar2 = unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>::
           operator->(in_RDX);
  ::std::__cxx11::string::string(local_c0,(string *)&pSVar2->query);
  pCVar3 = unique_ptr<duckdb::ClientContextLock,_std::default_delete<duckdb::ClientContextLock>,_true>
           ::operator*((unique_ptr<duckdb::ClientContextLock,_std::default_delete<duckdb::ClientContextLock>,_true>
                        *)&local_c8);
  InitialCleanup((ClientContext *)statement,pCVar3);
  pCVar3 = unique_ptr<duckdb::ClientContextLock,_std::default_delete<duckdb::ClientContextLock>,_true>
           ::operator*((unique_ptr<duckdb::ClientContextLock,_std::default_delete<duckdb::ClientContextLock>,_true>
                        *)&local_c8);
  _Var1._M_head_impl =
       (in_RDX->super_unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>).
       _M_t.super___uniq_ptr_impl<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>.
       _M_t.
       super__Tuple_impl<0UL,_duckdb::SQLStatement_*,_std::default_delete<duckdb::SQLStatement>_>.
       super__Head_base<0UL,_duckdb::SQLStatement_*,_false>._M_head_impl;
  (in_RDX->super_unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>)._M_t.
  super___uniq_ptr_impl<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::SQLStatement_*,_std::default_delete<duckdb::SQLStatement>_>.
  super__Head_base<0UL,_duckdb::SQLStatement_*,_false>._M_head_impl = (SQLStatement *)0x0;
  PrepareInternal(this,(ClientContextLock *)statement,
                  (unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>
                   *)pCVar3);
  if (_Var1._M_head_impl != (SQLStatement *)0x0) {
    (**(code **)((long)(_Var1._M_head_impl)->_vptr_SQLStatement + 8))();
  }
  ::std::__cxx11::string::~string(local_c0);
  ::std::unique_ptr<duckdb::ClientContextLock,_std::default_delete<duckdb::ClientContextLock>_>::
  ~unique_ptr(&local_c8);
  return (unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>_>)
         (unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>_>)
         this;
}

Assistant:

unique_ptr<PreparedStatement> ClientContext::Prepare(unique_ptr<SQLStatement> statement) {
	auto lock = LockContext();
	// prepare the query
	auto query = statement->query;
	try {
		InitialCleanup(*lock);
		return PrepareInternal(*lock, std::move(statement));
	} catch (std::exception &ex) {
		return ErrorResult<PreparedStatement>(ErrorData(ex), query);
	}
}